

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

bool absl::CUnescape(string_view source,Nonnull<std::string_*> dest,Nullable<std::string_*> error)

{
  byte bVar1;
  char32_t cVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_t sVar6;
  uint uVar7;
  byte *pbVar8;
  AlphaNum *pAVar9;
  size_type *psVar10;
  ulong uVar11;
  uint uVar12;
  char32_t cVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  char *pcVar18;
  ulong uVar19;
  byte *buffer;
  byte *pbVar20;
  bool bVar21;
  undefined1 local_e0 [48];
  byte *local_b0;
  byte *local_a8;
  undefined1 local_a0 [48];
  string local_70;
  Nonnull<std::string_*> local_50;
  uint local_44;
  ulong local_40;
  byte *local_38;
  
  pbVar20 = (byte *)source._M_str;
  sVar6 = source._M_len;
  std::__cxx11::string::resize((ulong)dest,(char)source._M_len);
  local_38 = (byte *)(dest->_M_dataplus)._M_p;
  pbVar17 = pbVar20 + sVar6;
  pbVar14 = local_38;
  pbVar8 = pbVar20;
  pbVar16 = pbVar20;
  buffer = local_38;
  if (0 < (long)sVar6 && local_38 == pbVar20) {
    while (pbVar16 = pbVar8, buffer = pbVar14, *pbVar8 != 0x5c) {
      pbVar16 = pbVar8 + 1;
      buffer = pbVar14 + 1;
      if ((pbVar8 != pbVar14) || (pbVar14 = buffer, pbVar8 = pbVar16, pbVar17 <= pbVar16)) break;
    }
  }
  uVar19 = (ulong)(pbVar16 >= pbVar17);
  if (pbVar16 < pbVar17) {
    pbVar20 = pbVar20 + (sVar6 - 1);
    uVar19 = 0;
    local_b0 = pbVar20;
    local_a8 = pbVar17;
    do {
      bVar1 = *pbVar16;
      pbVar14 = pbVar16;
      if (bVar1 != 0x5c) goto LAB_00272408;
      pbVar8 = pbVar16 + 1;
      if (pbVar20 < pbVar8) {
        if (error != (Nullable<std::string_*>)0x0) {
          std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x5a1840);
        }
        goto LAB_00272364;
      }
      bVar1 = *pbVar8;
      pAVar9 = (AlphaNum *)(ulong)bVar1;
      pbVar14 = pbVar8;
      if (bVar1 < 0x55) {
        if (bVar1 < 0x30) {
          if ((bVar1 == 0x22) || (bVar1 == 0x27)) goto LAB_00272408;
          goto switchD_0027246b_caseD_6f;
        }
        if (7 < bVar1 - 0x30) {
          if (bVar1 == 0x3f) goto LAB_00272408;
          goto switchD_0027246b_caseD_6f;
        }
        uVar12 = (int)(char)bVar1 - 0x30;
        if ((pbVar8 < pbVar20) && ((pbVar16[2] & 0xf8) == 0x30)) {
          uVar12 = ((uint)pbVar16[2] + uVar12 * 8) - 0x30;
          pbVar14 = pbVar16 + 2;
        }
        if ((pbVar14 < pbVar20) && (pbVar16 = pbVar14 + 1, (*pbVar16 & 0xf8) == 0x30)) {
          pbVar14 = pbVar14 + 1;
          uVar12 = ((uint)*pbVar16 + uVar12 * 8) - 0x30;
        }
        if (uVar12 < 0x100) {
          *buffer = (byte)uVar12;
          buffer = buffer + 1;
        }
        else if (error != (Nullable<std::string_*>)0x0) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pbVar8,pbVar14 + 1);
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x5a1859);
          local_e0._0_8_ = local_e0 + 0x10;
          psVar10 = puVar4 + 2;
          if ((size_type *)*puVar4 == psVar10) {
            local_e0._16_8_ = *psVar10;
            local_e0._24_8_ = puVar4[3];
          }
          else {
            local_e0._16_8_ = *psVar10;
            local_e0._0_8_ = (size_type *)*puVar4;
          }
          local_e0._8_8_ = puVar4[1];
          *puVar4 = psVar10;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append(local_e0);
          pAVar9 = (AlphaNum *)(plVar5 + 2);
          if ((AlphaNum *)*plVar5 == pAVar9) {
            local_a0._16_8_ = (pAVar9->piece_)._M_len;
            local_a0._24_8_ = plVar5[3];
            local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
          }
          else {
            local_a0._16_8_ = (pAVar9->piece_)._M_len;
            local_a0._0_8_ = (AlphaNum *)*plVar5;
          }
          local_a0._8_8_ = plVar5[1];
          *plVar5 = (long)pAVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)error,(string *)local_a0);
          if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
            operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
          }
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          pbVar17 = local_a8;
          pbVar20 = local_b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            pbVar17 = local_a8;
            pbVar20 = local_b0;
          }
        }
LAB_00272d21:
        if (0xff < uVar12) goto LAB_00272364;
      }
      else {
        if (bVar1 < 0x62) {
          if (bVar1 < 0x5c) {
            if (bVar1 == 0x55) {
              if (pbVar16 + 9 < pbVar17) {
                uVar11 = 0;
                uVar12 = 0;
                pbVar16 = pbVar16 + 3;
                local_50 = dest;
                local_40 = uVar19;
                cVar13 = L'\0';
                do {
                  pbVar15 = pbVar16;
                  bVar1 = pbVar15[-1];
                  if (-1 < (char)(&ascii_internal::kPropertyBits)[bVar1]) {
                    pbVar14 = pbVar15 + -2;
                    pbVar20 = local_b0;
                    if (error != (Nullable<std::string_*>)0x0) {
                      local_e0._0_8_ = local_e0 + 0x10;
                      local_44 = (uint)uVar11;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_e0,pbVar8,pbVar15 + -1);
                      plVar5 = (long *)std::__cxx11::string::replace
                                                 ((ulong)local_e0,0,(char *)0x0,0x5a18dc);
                      pAVar9 = (AlphaNum *)(plVar5 + 2);
                      if ((AlphaNum *)*plVar5 == pAVar9) {
                        local_a0._16_8_ = (pAVar9->piece_)._M_len;
                        local_a0._24_8_ = plVar5[3];
                        local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                      }
                      else {
                        local_a0._16_8_ = (pAVar9->piece_)._M_len;
                        local_a0._0_8_ = (AlphaNum *)*plVar5;
                      }
                      local_a0._8_8_ = plVar5[1];
                      *plVar5 = (long)pAVar9;
                      plVar5[1] = 0;
                      *(undefined1 *)(plVar5 + 2) = 0;
                      std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                      if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                      }
                      pbVar20 = local_b0;
                      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                      }
                      uVar11 = (ulong)local_44;
                      pbVar17 = local_a8;
                      uVar19 = local_40;
                    }
                    goto LAB_00272e6d;
                  }
                  if ((uint)cVar13 < 0x11000) {
                    uVar7 = bVar1 + 9;
                    if (bVar1 < 0x3a) {
                      uVar7 = (uint)bVar1;
                    }
                    pAVar9 = (AlphaNum *)(ulong)(uVar7 & 0xf);
                    cVar2 = cVar13 << 4 | uVar7 & 0xf;
                  }
                  else {
                    cVar2 = cVar13;
                    if (error != (Nullable<std::string_*>)0x0) {
                      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                      local_44 = (uint)uVar11;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_70,pbVar8,pbVar15);
                      puVar4 = (undefined8 *)
                               std::__cxx11::string::replace
                                         ((ulong)&local_70,0,(char *)0x0,0x5a1859);
                      local_e0._0_8_ = local_e0 + 0x10;
                      psVar10 = puVar4 + 2;
                      if ((size_type *)*puVar4 == psVar10) {
                        local_e0._16_8_ = *psVar10;
                        local_e0._24_8_ = puVar4[3];
                      }
                      else {
                        local_e0._16_8_ = *psVar10;
                        local_e0._0_8_ = (size_type *)*puVar4;
                      }
                      local_e0._8_8_ = puVar4[1];
                      *puVar4 = psVar10;
                      puVar4[1] = 0;
                      *(undefined1 *)(puVar4 + 2) = 0;
                      plVar5 = (long *)std::__cxx11::string::append(local_e0);
                      pAVar9 = (AlphaNum *)(plVar5 + 2);
                      if ((AlphaNum *)*plVar5 == pAVar9) {
                        local_a0._16_8_ = (pAVar9->piece_)._M_len;
                        local_a0._24_8_ = plVar5[3];
                        local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                      }
                      else {
                        local_a0._16_8_ = (pAVar9->piece_)._M_len;
                        local_a0._0_8_ = (AlphaNum *)*plVar5;
                      }
                      local_a0._8_8_ = plVar5[1];
                      *plVar5 = (long)pAVar9;
                      plVar5[1] = 0;
                      *(undefined1 *)(plVar5 + 2) = 0;
                      std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                      if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                      }
                      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                      uVar11 = (ulong)local_44;
                      pbVar17 = local_a8;
                      uVar19 = local_40;
                    }
                  }
                  if (0x10fff < (uint)cVar13) break;
                  bVar21 = 6 < uVar12;
                  uVar12 = uVar12 + 1;
                  pAVar9 = (AlphaNum *)(ulong)uVar12;
                  uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar21);
                  pbVar16 = pbVar15 + 1;
                  cVar13 = cVar2;
                } while (uVar12 != 8);
                pbVar14 = pbVar15 + -1;
                pbVar20 = local_b0;
                cVar13 = cVar2;
LAB_00272e6d:
                if ((uVar11 & 1) != 0) {
                  if ((error != (Nullable<std::string_*>)0x0) && ((cVar13 & 0xfffff800U) == 0xd800))
                  {
                    local_a0._0_8_ = (AlphaNum *)0x2c;
                    local_a0._8_8_ = "invalid surrogate character (0xD800-DFFF): \\";
                    local_e0._0_8_ = (byte *)0x9;
                    local_e0._8_8_ = pbVar8;
                    StrCat_abi_cxx11_(&local_70,(absl *)local_a0,(AlphaNum *)local_e0,pAVar9);
                    std::__cxx11::string::operator=((string *)error,(string *)&local_70);
                    pbVar17 = local_a8;
                    pbVar20 = local_b0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                      pbVar17 = local_a8;
                      pbVar20 = local_b0;
                    }
                  }
                  if ((cVar13 & 0xfffff800U) != 0xd800) {
                    sVar6 = strings_internal::EncodeUTF8Char((char *)buffer,cVar13);
                    buffer = buffer + sVar6;
                    bVar21 = true;
                    pbVar17 = local_a8;
                    pbVar20 = local_b0;
                    dest = local_50;
                    goto LAB_00272f57;
                  }
                }
                bVar21 = false;
                dest = local_50;
              }
              else {
                if (error != (Nullable<std::string_*>)0x0) {
                  local_e0._0_8_ = local_e0 + 0x10;
                  local_e0._8_8_ = (byte *)0x1;
                  local_e0[0x11] = 0;
                  local_e0[0x10] = *pbVar8;
                  plVar5 = (long *)std::__cxx11::string::replace
                                             ((ulong)local_e0,0,(char *)0x0,0x5a18dc);
                  goto LAB_00272af7;
                }
                bVar21 = false;
              }
LAB_00272f57:
              if (bVar21) goto LAB_00272d2c;
              goto LAB_00272364;
            }
            if (bVar1 == 0x58) goto switchD_0027246b_caseD_78;
          }
          else if ((bVar1 == 0x5c) || (bVar21 = bVar1 == 0x61, bVar1 = 7, bVar21))
          goto LAB_00272408;
switchD_0027246b_caseD_6f:
          if (error != (Nullable<std::string_*>)0x0) {
            buffer = local_e0 + 0x10;
            local_e0._0_8_ = buffer;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"Unknown escape sequence: \\","");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e0,*pbVar8);
            std::__cxx11::string::operator=((string *)error,(string *)local_a0);
            if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if ((byte *)local_e0._0_8_ != buffer) {
              operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
            }
          }
          goto LAB_00272364;
        }
        switch(bVar1) {
        case 0x6e:
          bVar1 = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x77:
          goto switchD_0027246b_caseD_6f;
        case 0x72:
          bVar1 = 0xd;
          break;
        case 0x74:
          bVar1 = 9;
          break;
        case 0x75:
          pbVar14 = pbVar16 + 5;
          if (pbVar14 < pbVar17) {
            pbVar16 = pbVar16 + 2;
            iVar3 = 4;
            cVar13 = L'\0';
            do {
              cVar2 = cVar13;
              bVar1 = *pbVar16;
              if (-1 < (char)((AlphaNum *)(ulong)bVar1)[0x1e04d].piece_._M_len) {
                pbVar14 = pbVar16 + -1;
                local_50 = dest;
                if (error == (Nullable<std::string_*>)0x0) goto LAB_00272dc6;
                local_e0._0_8_ = local_e0 + 0x10;
                local_40 = uVar19;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,pbVar8,pbVar16);
                dest = local_50;
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)local_e0,0,(char *)0x0,0x5a18b5);
                pAVar9 = (AlphaNum *)(plVar5 + 2);
                if ((AlphaNum *)*plVar5 == pAVar9) {
                  local_a0._16_8_ = (pAVar9->piece_)._M_len;
                  local_a0._24_8_ = plVar5[3];
                  local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                }
                else {
                  local_a0._16_8_ = (pAVar9->piece_)._M_len;
                  local_a0._0_8_ = (AlphaNum *)*plVar5;
                }
                local_a0._8_8_ = plVar5[1];
                *plVar5 = (long)pAVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                  operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                }
                uVar19 = local_40;
                pbVar8 = pbVar14;
                if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                  operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                  uVar19 = local_40;
                }
                goto LAB_00272b86;
              }
              uVar12 = bVar1 + 9;
              if (bVar1 < 0x3a) {
                uVar12 = (uint)bVar1;
              }
              cVar13 = uVar12 & 0xf | cVar2 << 4;
              pbVar16 = pbVar16 + 1;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            uVar12 = cVar2 & 0xfffff80;
            local_50 = dest;
            if ((error != (Nullable<std::string_*>)0x0) && (uVar12 == 0xd80)) {
              local_a0._0_8_ = (AlphaNum *)0x2c;
              local_a0._8_8_ = "invalid surrogate character (0xD800-DFFF): \\";
              local_e0._0_8_ = (byte *)0x5;
              local_e0._8_8_ = pbVar8;
              StrCat_abi_cxx11_(&local_70,(absl *)local_a0,(AlphaNum *)local_e0,
                                (AlphaNum *)(ulong)bVar1);
              std::__cxx11::string::operator=((string *)error,(string *)&local_70);
              pbVar17 = local_a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
                pbVar17 = local_a8;
              }
            }
            if (uVar12 == 0xd80) {
LAB_00272dc6:
              bVar21 = false;
              pbVar20 = local_b0;
              dest = local_50;
            }
            else {
              sVar6 = strings_internal::EncodeUTF8Char((char *)buffer,cVar13);
              buffer = buffer + sVar6;
              bVar21 = true;
              pbVar17 = local_a8;
              pbVar20 = local_b0;
              dest = local_50;
            }
          }
          else if (error == (Nullable<std::string_*>)0x0) {
            bVar21 = false;
            pbVar14 = pbVar8;
            pbVar20 = local_b0;
          }
          else {
            local_e0._0_8_ = local_e0 + 0x10;
            local_e0._8_8_ = (byte *)0x1;
            local_e0[0x11] = 0;
            local_e0[0x10] = *pbVar8;
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_e0,0,(char *)0x0,0x5a18b5);
LAB_00272af7:
            pAVar9 = (AlphaNum *)(plVar5 + 2);
            if ((AlphaNum *)*plVar5 == pAVar9) {
              local_a0._16_8_ = (pAVar9->piece_)._M_len;
              local_a0._24_8_ = plVar5[3];
              local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
            }
            else {
              local_a0._16_8_ = (pAVar9->piece_)._M_len;
              local_a0._0_8_ = (AlphaNum *)*plVar5;
            }
            local_a0._8_8_ = plVar5[1];
            *plVar5 = (long)pAVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)error,(string *)local_a0);
            if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
            }
LAB_00272b86:
            bVar21 = false;
            pbVar17 = local_a8;
            pbVar14 = pbVar8;
            pbVar20 = local_b0;
          }
          goto LAB_00272f57;
        case 0x76:
          bVar1 = 0xb;
          break;
        case 0x78:
switchD_0027246b_caseD_78:
          if (pbVar8 < pbVar20) {
            if ((char)(&ascii_internal::kPropertyBits)[pbVar16[2]] < '\0') {
              uVar12 = 0;
              do {
                bVar1 = pbVar14[1];
                if (-1 < (char)(&ascii_internal::kPropertyBits)[bVar1]) break;
                pbVar14 = pbVar14 + 1;
                uVar7 = bVar1 + 9;
                if (bVar1 < 0x3a) {
                  uVar7 = (uint)bVar1;
                }
                uVar12 = uVar12 << 4 | uVar7 & 0xf;
              } while (pbVar14 < pbVar20);
              if (uVar12 < 0x100) {
                *buffer = (byte)uVar12;
                buffer = buffer + 1;
              }
              else if (error != (Nullable<std::string_*>)0x0) {
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_70,pbVar8,pbVar14 + 1);
                puVar4 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x5a1859);
                local_e0._0_8_ = local_e0 + 0x10;
                psVar10 = puVar4 + 2;
                if ((size_type *)*puVar4 == psVar10) {
                  local_e0._16_8_ = *psVar10;
                  local_e0._24_8_ = puVar4[3];
                }
                else {
                  local_e0._16_8_ = *psVar10;
                  local_e0._0_8_ = (size_type *)*puVar4;
                }
                local_e0._8_8_ = puVar4[1];
                *puVar4 = psVar10;
                puVar4[1] = 0;
                *(undefined1 *)(puVar4 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append(local_e0);
                pAVar9 = (AlphaNum *)(plVar5 + 2);
                if ((AlphaNum *)*plVar5 == pAVar9) {
                  local_a0._16_8_ = (pAVar9->piece_)._M_len;
                  local_a0._24_8_ = plVar5[3];
                  local_a0._0_8_ = (AlphaNum *)(local_a0 + 0x10);
                }
                else {
                  local_a0._16_8_ = (pAVar9->piece_)._M_len;
                  local_a0._0_8_ = (AlphaNum *)*plVar5;
                }
                local_a0._8_8_ = plVar5[1];
                *plVar5 = (long)pAVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                std::__cxx11::string::operator=((string *)error,(string *)local_a0);
                if ((AlphaNum *)local_a0._0_8_ != (AlphaNum *)(local_a0 + 0x10)) {
                  operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
                }
                if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                  operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                }
                pbVar17 = local_a8;
                pbVar20 = local_b0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                  pbVar17 = local_a8;
                  pbVar20 = local_b0;
                }
              }
              goto LAB_00272d21;
            }
            if (error == (Nullable<std::string_*>)0x0) goto LAB_00272364;
            pcVar18 = "\\x cannot be followed by a non-hex digit";
          }
          else {
            if (error == (Nullable<std::string_*>)0x0) goto LAB_00272364;
            pcVar18 = "String cannot end with \\x";
          }
          std::__cxx11::string::operator=((string *)error,pcVar18);
          goto LAB_00272364;
        default:
          if (bVar1 == 0x66) {
            bVar1 = 0xc;
          }
          else {
            if (bVar1 != 0x62) goto switchD_0027246b_caseD_6f;
            bVar1 = 8;
          }
        }
LAB_00272408:
        *buffer = bVar1;
        buffer = buffer + 1;
      }
LAB_00272d2c:
      pbVar16 = pbVar14 + 1;
      uVar19 = CONCAT71((int7)(uVar19 >> 8),pbVar17 <= pbVar16);
    } while (pbVar17 > pbVar16);
  }
  buffer = buffer + -(long)local_38;
LAB_00272364:
  if ((uVar19 & 1) != 0) {
    if ((byte *)dest->_M_string_length < buffer) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 buffer);
    }
    dest->_M_string_length = (size_type)buffer;
    buffer[(long)(dest->_M_dataplus)._M_p] = 0;
  }
  return (bool)((byte)uVar19 & 1);
}

Assistant:

bool CUnescape(absl::string_view source, absl::Nonnull<std::string*> dest,
               absl::Nullable<std::string*> error) {
  return CUnescapeInternal(source, kUnescapeNulls, dest, error);
}